

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UEnumeration * ures_openAvailableLocales_63(char *path,UErrorCode *status)

{
  UBool UVar1;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  ULocalesContext *myContext;
  UEnumeration *en;
  UResourceBundle *idx;
  UErrorCode *status_local;
  char *path_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    resB = (UResourceBundle *)uprv_malloc_63(400);
    myContext = (ULocalesContext *)uprv_malloc_63(0x38);
    if ((myContext == (ULocalesContext *)0x0) || (resB == (UResourceBundle *)0x0)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      uprv_free_63(myContext);
      uprv_free_63(resB);
      path_local = (char *)0x0;
    }
    else {
      memcpy(myContext,&gLocalesEnum,0x38);
      ures_initStackObject_63(resB);
      ures_initStackObject_63(resB + 1);
      resB_00 = ures_openDirect_63(path,"res_index",status);
      ures_getByKey_63(resB_00,"InstalledLocales",resB,status);
      UVar1 = U_SUCCESS(*status);
      if (UVar1 == '\0') {
        ures_close_63(resB);
        uprv_free_63(resB);
        uprv_free_63(myContext);
        myContext = (ULocalesContext *)0x0;
      }
      else {
        (myContext->installed).fData = (UResourceDataEntry *)resB;
      }
      ures_close_63(resB_00);
      path_local = (char *)myContext;
    }
  }
  else {
    path_local = (char *)0x0;
  }
  return (UEnumeration *)path_local;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ures_openAvailableLocales(const char *path, UErrorCode *status)
{
    UResourceBundle *idx = NULL;
    UEnumeration *en = NULL;
    ULocalesContext *myContext = NULL;

    if(U_FAILURE(*status)) {
        return NULL;
    }
    myContext = static_cast<ULocalesContext *>(uprv_malloc(sizeof(ULocalesContext)));
    en =  (UEnumeration *)uprv_malloc(sizeof(UEnumeration));
    if(!en || !myContext) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        uprv_free(en);
        uprv_free(myContext);
        return NULL;
    }
    uprv_memcpy(en, &gLocalesEnum, sizeof(UEnumeration));

    ures_initStackObject(&myContext->installed);
    ures_initStackObject(&myContext->curr);
    idx = ures_openDirect(path, INDEX_LOCALE_NAME, status);
    ures_getByKey(idx, INDEX_TAG, &myContext->installed, status);
    if(U_SUCCESS(*status)) {
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "Got %s::%s::[%s] : %s\n", 
            path, INDEX_LOCALE_NAME, INDEX_TAG, ures_getKey(&myContext->installed));
#endif
        en->context = myContext;
    } else {
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "%s open failed - %s\n", path, u_errorName(*status));
#endif
        ures_close(&myContext->installed);
        uprv_free(myContext);
        uprv_free(en);
        en = NULL;
    }
    
    ures_close(idx);
    
    return en;
}